

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzer.cpp
# Opt level: O2

void __thiscall ModbusAnalyzer::ComputeSampleOffsets(ModbusAnalyzer *this)

{
  Mode MVar1;
  ParityAndStopbits PVar2;
  pointer puVar3;
  ModbusAnalyzerSettings *pMVar4;
  U32 UVar5;
  int iVar6;
  ClockGenerator clock_generator;
  ClockGenerator aCStack_38 [12];
  uint local_2c;
  
  ClockGenerator::ClockGenerator(aCStack_38);
  ClockGenerator::Init((double)((this->mSettings)._M_ptr)->mBitRate,(uint)aCStack_38);
  puVar3 = (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar3) {
    (this->mSampleOffsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  pMVar4 = (this->mSettings)._M_ptr;
  UVar5 = pMVar4->mBitsPerTransfer;
  MVar1 = pMVar4->mModbusMode;
  local_2c = ClockGenerator::AdvanceByHalfPeriod(1.5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&this->mSampleOffsets,&local_2c);
  iVar6 = UVar5 + (MVar1 != Normal);
  while (iVar6 = iVar6 + -1, iVar6 != 0) {
    local_2c = ClockGenerator::AdvanceByHalfPeriod(1.0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->mSampleOffsets,&local_2c);
  }
  PVar2 = ((this->mSettings)._M_ptr)->mParity;
  if ((PVar2 != NoneTwo) && (PVar2 != NoneOne)) {
    UVar5 = ClockGenerator::AdvanceByHalfPeriod(1.0);
    this->mParityBitOffset = UVar5;
  }
  UVar5 = ClockGenerator::AdvanceByHalfPeriod(1.0);
  this->mStartOfStopBitOffset = UVar5;
  ClockGenerator::~ClockGenerator(aCStack_38);
  return;
}

Assistant:

void ModbusAnalyzer::ComputeSampleOffsets()
{
    ClockGenerator clock_generator;
    clock_generator.Init( mSettings->mBitRate, mSampleRateHz );

    mSampleOffsets.clear();

    U32 num_bits = mSettings->mBitsPerTransfer;

    if( mSettings->mModbusMode != ModbusAnalyzerEnums::Normal )
        num_bits++;

    mSampleOffsets.push_back( clock_generator.AdvanceByHalfPeriod( 1.5 ) ); // point to the center of the 1st bit (past the start bit)
    num_bits--;                                                             // we just added the first bit.

    for( U32 i = 0; i < num_bits; i++ )
    {
        mSampleOffsets.push_back( clock_generator.AdvanceByHalfPeriod() );
    }

    if( mSettings->mParity != ModbusAnalyzerEnums::NoneOne && mSettings->mParity != ModbusAnalyzerEnums::NoneTwo )
        mParityBitOffset = clock_generator.AdvanceByHalfPeriod();

    // to check for framing errors, we also want to check
    // 1/2 bit after the beginning of the stop bit
    mStartOfStopBitOffset = clock_generator.AdvanceByHalfPeriod(
        1.0 ); // i.e. moving from the center of the last data bit (where we left off) to 1/2 period into the stop bit
}